

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O1

econf_err key_file_append(econf_file *kf)

{
  ulong uVar1;
  size_t sVar2;
  file_entry *pfVar3;
  econf_err eVar4;
  
  if (kf == (econf_file *)0x0) {
    eVar4 = ECONF_ERROR;
  }
  else {
    uVar1 = kf->length;
    kf->length = uVar1 + 1;
    eVar4 = ECONF_SUCCESS;
    if (kf->alloc_length <= uVar1) {
      sVar2 = kf->alloc_length + 1;
      kf->alloc_length = sVar2;
      pfVar3 = (file_entry *)realloc(kf->file_entry,sVar2 * 0x38);
      kf->file_entry = pfVar3;
      if (pfVar3 == (file_entry *)0x0) {
        eVar4 = ECONF_NOMEM;
      }
      else {
        initialize(kf,kf->alloc_length - 1);
        eVar4 = ECONF_SUCCESS;
      }
    }
  }
  return eVar4;
}

Assistant:

econf_err key_file_append(econf_file *kf) {
  if (kf == NULL)
    return ECONF_ERROR;
  if(kf->length++ >= kf->alloc_length) {
    kf->alloc_length++;
    kf->file_entry =
      realloc(kf->file_entry, (kf->alloc_length) * sizeof(struct file_entry));
    if (kf->file_entry == NULL)
      return ECONF_NOMEM;
    initialize(kf, kf->alloc_length - 1);
  }
  return ECONF_SUCCESS;
}